

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# preprocessor.cpp
# Opt level: O0

void __thiscall
mocker::RenameASTIdentifiers::operator()(RenameASTIdentifiers *this,IdentifierExpr *node)

{
  unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Declaration>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>_>
  *this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  element_type *peVar5;
  NodeID local_30;
  undefined1 local_28 [8];
  shared_ptr<mocker::ast::VarDecl> decl;
  IdentifierExpr *node_local;
  RenameASTIdentifiers *this_local;
  
  decl.super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)node;
  peVar2 = std::
           __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&node->identifier);
  bVar1 = std::operator==(&peVar2->val,"this");
  if (!bVar1) {
    this_00 = this->associatedDecl;
    peVar2 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&decl.
                              super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._M_use_count);
    local_30 = ast::ASTNode::getID(&peVar2->super_ASTNode);
    std::
    unordered_map<unsigned_long,_std::shared_ptr<mocker::ast::Declaration>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<mocker::ast::Declaration>_>_>_>
    ::at(this_00,&local_30);
    std::dynamic_pointer_cast<mocker::ast::VarDecl,mocker::ast::Declaration>
              ((shared_ptr<mocker::ast::Declaration> *)local_28);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_28);
    if (!bVar1) {
      __assert_fail("decl",
                    "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/preprocessor.cpp"
                    ,0x74,
                    "virtual void mocker::RenameASTIdentifiers::operator()(ast::IdentifierExpr &) const"
                   );
    }
    peVar3 = std::
             __shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)local_28);
    peVar4 = std::
             __shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::VarDeclStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar3->decl);
    peVar2 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&peVar4->identifier);
    peVar5 = std::
             __shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&decl.
                              super___shared_ptr<mocker::ast::VarDecl,_(__gnu_cxx::_Lock_policy)2>.
                              _M_refcount._M_pi[1]._M_use_count);
    std::__cxx11::string::operator=((string *)&peVar5->val,(string *)&peVar2->val);
    std::shared_ptr<mocker::ast::VarDecl>::~shared_ptr((shared_ptr<mocker::ast::VarDecl> *)local_28)
    ;
  }
  return;
}

Assistant:

void operator()(ast::IdentifierExpr &node) const override {
    if (node.identifier->val == "this")
      return;
    auto decl = std::dynamic_pointer_cast<ast::VarDecl>(
        associatedDecl.at(node.identifier->getID()));
    assert(decl);
    node.identifier->val = decl->decl->identifier->val;
  }